

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::FboTestUtil::DepthGradientShader::shadeFragments
          (DepthGradientShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  GenericVec4 *pGVar5;
  FragmentPacket *packet;
  ulong uVar6;
  int fragNdx;
  int fragNdx_00;
  deUint32 dVar7;
  deUint32 dVar8;
  deUint32 dVar9;
  deUint32 dVar10;
  Vec4 color;
  Vec4 coord;
  IVec4 icolor;
  UVec4 uicolor;
  Vector<float,_4> local_b0;
  FragmentPacket *local_a0;
  ulong local_98;
  ulong local_90;
  float local_88;
  float local_84;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  fVar1 = (this->u_minGradient->value).f;
  fVar2 = (this->u_maxGradient->value).f;
  local_a0 = packets;
  tcu::Vector<float,_4>::Vector(&local_b0,(float (*) [4])&this->u_color->value);
  castVectorSaturate<int>(&local_b0);
  castVectorSaturate<unsigned_int>(&local_b0);
  local_68 = local_48;
  uStack_60 = uStack_40;
  uVar6 = 0;
  local_98 = (ulong)(uint)numPackets;
  if (numPackets < 1) {
    local_98 = uVar6;
  }
  local_78 = local_58;
  uStack_70 = uStack_50;
  local_90 = 0;
  do {
    if (local_90 == local_98) {
      return;
    }
    packet = local_a0 + local_90;
    for (fragNdx_00 = 0; fragNdx_00 != 4; fragNdx_00 = fragNdx_00 + 1) {
      rr::readTriangleVarying<float>((rr *)&local_88,packet,context,0,fragNdx_00);
      iVar4 = (int)uVar6 + fragNdx_00;
      context->fragmentDepths[context->numSamples * iVar4] =
           (local_88 + local_84) * 0.5 * (fVar2 - fVar1) + fVar1;
      iVar3 = *(int *)&(this->super_ShaderProgram).field_0x154;
      if (iVar3 == 0x22) {
        iVar3 = context->numFragmentOutputs;
        pGVar5 = context->outputArray;
        dVar7 = (deUint32)local_68;
        dVar8 = local_68._4_4_;
        dVar9 = (deUint32)uStack_60;
        dVar10 = uStack_60._4_4_;
LAB_01135c27:
        pGVar5 = pGVar5 + iVar4 * iVar3;
        (pGVar5->v).uData[0] = dVar7;
        (pGVar5->v).uData[1] = dVar8;
        (pGVar5->v).uData[2] = dVar9;
        (pGVar5->v).uData[3] = dVar10;
      }
      else {
        if (iVar3 == 0x1e) {
          iVar3 = context->numFragmentOutputs;
          pGVar5 = context->outputArray;
          dVar7 = (deUint32)local_78;
          dVar8 = local_78._4_4_;
          dVar9 = (deUint32)uStack_70;
          dVar10 = uStack_70._4_4_;
          goto LAB_01135c27;
        }
        if (iVar3 == 4) {
          pGVar5 = context->outputArray;
          iVar4 = iVar4 * context->numFragmentOutputs;
          pGVar5[iVar4].v.uData[0] = (deUint32)local_b0.m_data[0];
          pGVar5[iVar4].v.uData[1] = (deUint32)local_b0.m_data[1];
          pGVar5[iVar4].v.uData[2] = (deUint32)local_b0.m_data[2];
          pGVar5[iVar4].v.uData[3] = (deUint32)local_b0.m_data[3];
        }
      }
    }
    local_90 = local_90 + 1;
    uVar6 = (ulong)((int)uVar6 + 4);
  } while( true );
}

Assistant:

void DepthGradientShader::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	const float			gradientMin	(u_minGradient.value.f);
	const float			gradientMax	(u_maxGradient.value.f);
	const tcu::Vec4		color		(u_color.value.f4);
	const tcu::IVec4	icolor		(castVectorSaturate<deInt32>(color));
	const tcu::UVec4	uicolor		(castVectorSaturate<deUint32>(color));

	// running this shader without a depth buffer does not make any sense
	DE_ASSERT(context.fragmentDepths);

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
	{
		const tcu::Vec4		coord	= rr::readTriangleVarying<float>(packets[packetNdx], context, 0, fragNdx);
		const float			x		= coord.x();
		const float			y		= coord.y();
		const float			f0		= (x + y) * 0.5f;

		rr::writeFragmentDepth(context, packetNdx, fragNdx, 0, gradientMin + (gradientMax-gradientMin) * f0);

		if (m_outputType == glu::TYPE_FLOAT_VEC4)			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
		else if (m_outputType == glu::TYPE_INT_VEC4)		rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, icolor);
		else if (m_outputType == glu::TYPE_UINT_VEC4)		rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, uicolor);
		else
			DE_ASSERT(DE_FALSE);
	}
}